

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::TextureSpecificationTests::init
          (TextureSpecificationTests *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  Context *pCVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  int extraout_EAX;
  TestNode *pTVar6;
  BasicTexImage2DCase *this_00;
  BasicTexImageCubeCase *this_01;
  RandomOrderTexImage2DCase *this_02;
  RandomOrderTexImageCubeCase *this_03;
  TexImage2DAlignCase *pTVar7;
  TexImageCubeAlignCase *pTVar8;
  BasicTexSubImage2DCase *this_04;
  BasicTexSubImageCubeCase *this_05;
  TexSubImage2DEmptyTexCase *this_06;
  TexSubImageCubeEmptyTexCase *this_07;
  TexSubImage2DAlignCase *pTVar9;
  TexSubImageCubeAlignCase *pTVar10;
  BasicCopyTexImage2DCase *pBVar11;
  BasicCopyTexImageCubeCase *pBVar12;
  BasicCopyTexSubImage2DCase *pBVar13;
  BasicCopyTexSubImageCubeCase *pBVar14;
  long lVar15;
  ulong uVar16;
  int width;
  TestNode *this_08;
  allocator<char> local_c1;
  TestNode *local_c0;
  int local_b4;
  TestNode *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  long local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  Random rnd;
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_teximage2d","Basic glTexImage2D() usage");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  lVar15 = 0;
  local_b0 = (TestNode *)this;
  while (this_08 = local_b0, lVar15 != 0x80) {
    pcVar1 = *(char **)((long)&DAT_0071b470 + lVar15);
    dVar3 = *(deUint32 *)((long)&DAT_0071b478 + lVar15);
    local_c0 = (TestNode *)CONCAT44(local_c0._4_4_,*(undefined4 *)((long)&DAT_0071b47c + lVar15));
    local_88 = lVar15;
    this_00 = (BasicTexImage2DCase *)operator_new(0xa08);
    pCVar2 = (Context *)this_08[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,pcVar1,(allocator<char> *)&local_60);
    std::operator+(&local_a8,&local_80,"_2d");
    BasicTexImage2DCase::BasicTexImage2DCase
              (this_00,pCVar2,local_a8._M_dataplus._M_p,"",dVar3,(deUint32)local_c0,1,0x40,0x80);
    tcu::TestNode::addChild(pTVar6,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_80);
    this_01 = (BasicTexImageCubeCase *)operator_new(0xa08);
    pCVar2 = (Context *)local_b0[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,pcVar1,(allocator<char> *)&local_60);
    std::operator+(&local_a8,&local_80,"_cube");
    BasicTexImageCubeCase::BasicTexImageCubeCase
              (this_01,pCVar2,local_a8._M_dataplus._M_p,"",dVar3,(deUint32)local_c0,1,0x40,0x40);
    tcu::TestNode::addChild(pTVar6,(TestNode *)this_01);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_80);
    lVar15 = local_88 + 0x10;
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,this_08->m_testCtx,"random_teximage2d",
             "Randomized glTexImage2D() usage");
  tcu::TestNode::addChild(this_08,pTVar6);
  deRandom_init(&rnd.m_rnd,9);
  local_c0 = pTVar6;
  for (local_b4 = 0; local_b4 < 10; local_b4 = local_b4 + 1) {
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    dVar5 = deRandom_getUint32(&rnd.m_rnd);
    this_02 = (RandomOrderTexImage2DCase *)operator_new(0xa08);
    pCVar2 = (Context *)local_b0[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"2d_",&local_c1);
    de::toString<int>(&local_60,&local_b4);
    std::operator+(&local_a8,&local_80,&local_60);
    uVar16 = (ulong)((dVar3 & 7) << 4);
    RandomOrderTexImage2DCase::RandomOrderTexImage2DCase
              (this_02,pCVar2,local_a8._M_dataplus._M_p,"",
               *(deUint32 *)((long)&DAT_0071b478 + uVar16),
               *(deUint32 *)((long)&DAT_0071b47c + uVar16),1,4 << (sbyte)((ulong)dVar4 % 7),
               4 << (sbyte)((ulong)dVar5 % 7));
    tcu::TestNode::addChild(local_c0,(TestNode *)this_02);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    this_08 = local_b0;
  }
  for (local_b4 = 0; local_b4 < 10; local_b4 = local_b4 + 1) {
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    width = 4 << (sbyte)((ulong)dVar4 % 7);
    this_03 = (RandomOrderTexImageCubeCase *)operator_new(0xa08);
    pCVar2 = (Context *)local_b0[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"cube_",&local_c1);
    de::toString<int>(&local_60,&local_b4);
    std::operator+(&local_a8,&local_80,&local_60);
    uVar16 = (ulong)((dVar3 & 7) << 4);
    RandomOrderTexImageCubeCase::RandomOrderTexImageCubeCase
              (this_03,pCVar2,local_a8._M_dataplus._M_p,"",
               *(deUint32 *)((long)&DAT_0071b478 + uVar16),
               *(deUint32 *)((long)&DAT_0071b47c + uVar16),1,width,width);
    tcu::TestNode::addChild(local_c0,(TestNode *)this_03);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    this_08 = local_b0;
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,this_08->m_testCtx,"teximage2d_align",
             "glTexImage2D() unpack alignment tests");
  tcu::TestNode::addChild(this_08,pTVar6);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_l8_4_8","",0x1909,0x1401,1,4,8,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_l8_63_1","",0x1909,0x1401,0,0x3f,0x1e,1
            );
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_l8_63_2","",0x1909,0x1401,0,0x3f,0x1e,2
            );
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_l8_63_4","",0x1909,0x1401,0,0x3f,0x1e,4
            );
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_l8_63_8","",0x1909,0x1401,0,0x3f,0x1e,8
            );
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_rgba4444_51_1","",0x1908,0x8033,0,0x33,
             0x1e,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_rgba4444_51_2","",0x1908,0x8033,0,0x33,
             0x1e,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_rgba4444_51_4","",0x1908,0x8033,0,0x33,
             0x1e,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_rgba4444_51_8","",0x1908,0x8033,0,0x33,
             0x1e,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_rgb888_39_1","",0x1907,0x1401,0,0x27,
             0x2b,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_rgb888_39_2","",0x1907,0x1401,0,0x27,
             0x2b,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_rgb888_39_4","",0x1907,0x1401,0,0x27,
             0x2b,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_rgb888_39_8","",0x1907,0x1401,0,0x27,
             0x2b,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_rgba8888_47_1","",0x1908,0x1401,0,0x2f,
             0x1b,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_rgba8888_47_2","",0x1908,0x1401,0,0x2f,
             0x1b,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_rgba8888_47_4","",0x1908,0x1401,0,0x2f,
             0x1b,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(Context *)this_08[1]._vptr_TestNode,"2d_rgba8888_47_8","",0x1908,0x1401,0,0x2f,
             0x1b,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar7);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_l8_4_8","",0x1909,0x1401,1,4,4,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_l8_63_1","",0x1909,0x1401,0,0x3f,0x3f
             ,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_l8_63_2","",0x1909,0x1401,0,0x3f,0x3f
             ,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_l8_63_4","",0x1909,0x1401,0,0x3f,0x3f
             ,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_l8_63_8","",0x1909,0x1401,0,0x3f,0x3f
             ,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_rgba4444_51_1","",0x1908,0x8033,0,
             0x33,0x33,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_rgba4444_51_2","",0x1908,0x8033,0,
             0x33,0x33,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_rgba4444_51_4","",0x1908,0x8033,0,
             0x33,0x33,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_rgba4444_51_8","",0x1908,0x8033,0,
             0x33,0x33,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_rgb888_39_1","",0x1907,0x1401,0,0x27,
             0x27,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_rgb888_39_2","",0x1907,0x1401,0,0x27,
             0x27,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_rgb888_39_4","",0x1907,0x1401,0,0x27,
             0x27,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_rgb888_39_8","",0x1907,0x1401,0,0x27,
             0x27,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_rgba8888_47_1","",0x1908,0x1401,0,
             0x2f,0x2f,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_rgba8888_47_2","",0x1908,0x1401,0,
             0x2f,0x2f,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_rgba8888_47_4","",0x1908,0x1401,0,
             0x2f,0x2f,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(Context *)this_08[1]._vptr_TestNode,"cube_rgba8888_47_8","",0x1908,0x1401,0,
             0x2f,0x2f,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,this_08->m_testCtx,"basic_texsubimage2d",
             "Basic glTexSubImage2D() usage");
  tcu::TestNode::addChild(this_08,pTVar6);
  lVar15 = 0;
  while (lVar15 != 0x80) {
    pcVar1 = *(char **)((long)&DAT_0071b470 + lVar15);
    dVar3 = *(deUint32 *)((long)&DAT_0071b478 + lVar15);
    local_c0 = (TestNode *)CONCAT44(local_c0._4_4_,*(undefined4 *)((long)&DAT_0071b47c + lVar15));
    local_88 = lVar15;
    this_04 = (BasicTexSubImage2DCase *)operator_new(0xa08);
    pCVar2 = (Context *)this_08[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,pcVar1,(allocator<char> *)&local_60);
    std::operator+(&local_a8,&local_80,"_2d");
    BasicTexSubImage2DCase::BasicTexSubImage2DCase
              (this_04,pCVar2,local_a8._M_dataplus._M_p,"",dVar3,(deUint32)local_c0,1,0x40,0x80);
    tcu::TestNode::addChild(pTVar6,(TestNode *)this_04);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_80);
    this_05 = (BasicTexSubImageCubeCase *)operator_new(0xa08);
    pCVar2 = (Context *)local_b0[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,pcVar1,(allocator<char> *)&local_60);
    std::operator+(&local_a8,&local_80,"_cube");
    BasicTexSubImageCubeCase::BasicTexSubImageCubeCase
              (this_05,pCVar2,local_a8._M_dataplus._M_p,"",dVar3,(deUint32)local_c0,1,0x40,0x40);
    tcu::TestNode::addChild(pTVar6,(TestNode *)this_05);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_80);
    this_08 = local_b0;
    lVar15 = local_88 + 0x10;
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,this_08->m_testCtx,"texsubimage2d_empty_tex",
             "glTexSubImage2D() to texture that has storage but no data");
  tcu::TestNode::addChild(this_08,pTVar6);
  lVar15 = 0;
  while (lVar15 != 0x80) {
    pcVar1 = *(char **)((long)&DAT_0071b470 + lVar15);
    dVar3 = *(deUint32 *)((long)&DAT_0071b478 + lVar15);
    local_c0 = (TestNode *)CONCAT44(local_c0._4_4_,*(undefined4 *)((long)&DAT_0071b47c + lVar15));
    local_88 = lVar15;
    this_06 = (TexSubImage2DEmptyTexCase *)operator_new(0xa08);
    pCVar2 = (Context *)this_08[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,pcVar1,(allocator<char> *)&local_60);
    std::operator+(&local_a8,&local_80,"_2d");
    TexSubImage2DEmptyTexCase::TexSubImage2DEmptyTexCase
              (this_06,pCVar2,local_a8._M_dataplus._M_p,"",dVar3,(deUint32)local_c0,1,0x40,0x20);
    tcu::TestNode::addChild(pTVar6,(TestNode *)this_06);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_80);
    this_07 = (TexSubImageCubeEmptyTexCase *)operator_new(0xa08);
    pCVar2 = (Context *)local_b0[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,pcVar1,(allocator<char> *)&local_60);
    std::operator+(&local_a8,&local_80,"_cube");
    TexSubImageCubeEmptyTexCase::TexSubImageCubeEmptyTexCase
              (this_07,pCVar2,local_a8._M_dataplus._M_p,"",dVar3,(deUint32)local_c0,1,0x20,0x20);
    tcu::TestNode::addChild(pTVar6,(TestNode *)this_07);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_80);
    this_08 = local_b0;
    lVar15 = local_88 + 0x10;
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,this_08->m_testCtx,"texsubimage2d_align",
             "glTexSubImage2D() unpack alignment tests");
  tcu::TestNode::addChild(this_08,pTVar6);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_l8_1_1","",0x1909,0x1401,0x40,0x40,0xd,
             0x11,1,6,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_l8_1_2","",0x1909,0x1401,0x40,0x40,0xd,
             0x11,1,6,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_l8_1_4","",0x1909,0x1401,0x40,0x40,0xd,
             0x11,1,6,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_l8_1_8","",0x1909,0x1401,0x40,0x40,0xd,
             0x11,1,6,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_l8_63_1","",0x1909,0x1401,0x40,0x40,1,9
             ,0x3f,0x1e,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_l8_63_2","",0x1909,0x1401,0x40,0x40,1,9
             ,0x3f,0x1e,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_l8_63_4","",0x1909,0x1401,0x40,0x40,1,9
             ,0x3f,0x1e,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_l8_63_8","",0x1909,0x1401,0x40,0x40,1,9
             ,0x3f,0x1e,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_rgba4444_51_1","",0x1908,0x8033,0x40,
             0x40,7,0x1d,0x33,0x1e,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_rgba4444_51_2","",0x1908,0x8033,0x40,
             0x40,7,0x1d,0x33,0x1e,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_rgba4444_51_4","",0x1908,0x8033,0x40,
             0x40,7,0x1d,0x33,0x1e,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_rgba4444_51_8","",0x1908,0x8033,0x40,
             0x40,7,0x1d,0x33,0x1e,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_rgb888_39_1","",0x1907,0x1401,0x40,0x40
             ,0xb,8,0x27,0x2b,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_rgb888_39_2","",0x1907,0x1401,0x40,0x40
             ,0xb,8,0x27,0x2b,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_rgb888_39_4","",0x1907,0x1401,0x40,0x40
             ,0xb,8,0x27,0x2b,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_rgb888_39_8","",0x1907,0x1401,0x40,0x40
             ,0xb,8,0x27,0x2b,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_rgba8888_47_1","",0x1908,0x1401,0x40,
             0x40,10,1,0x2f,0x1b,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_rgba8888_47_2","",0x1908,0x1401,0x40,
             0x40,10,1,0x2f,0x1b,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_rgba8888_47_4","",0x1908,0x1401,0x40,
             0x40,10,1,0x2f,0x1b,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(Context *)this_08[1]._vptr_TestNode,"2d_rgba8888_47_8","",0x1908,0x1401,0x40,
             0x40,10,1,0x2f,0x1b,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_l8_1_1","",0x1909,0x1401,0x40,0x40,
             0xd,0x11,1,6,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_l8_1_2","",0x1909,0x1401,0x40,0x40,
             0xd,0x11,1,6,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_l8_1_4","",0x1909,0x1401,0x40,0x40,
             0xd,0x11,1,6,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_l8_1_8","",0x1909,0x1401,0x40,0x40,
             0xd,0x11,1,6,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_l8_63_1","",0x1909,0x1401,0x40,0x40,
             1,9,0x3f,0x1e,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_l8_63_2","",0x1909,0x1401,0x40,0x40,
             1,9,0x3f,0x1e,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_l8_63_4","",0x1909,0x1401,0x40,0x40,
             1,9,0x3f,0x1e,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_l8_63_8","",0x1909,0x1401,0x40,0x40,
             1,9,0x3f,0x1e,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_rgba4444_51_1","",0x1908,0x8033,0x40
             ,0x40,7,0x1d,0x33,0x1e,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_rgba4444_51_2","",0x1908,0x8033,0x40
             ,0x40,7,0x1d,0x33,0x1e,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_rgba4444_51_4","",0x1908,0x8033,0x40
             ,0x40,7,0x1d,0x33,0x1e,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_rgba4444_51_8","",0x1908,0x8033,0x40
             ,0x40,7,0x1d,0x33,0x1e,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_rgb888_39_1","",0x1907,0x1401,0x40,
             0x40,0xb,8,0x27,0x2b,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_rgb888_39_2","",0x1907,0x1401,0x40,
             0x40,0xb,8,0x27,0x2b,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_rgb888_39_4","",0x1907,0x1401,0x40,
             0x40,0xb,8,0x27,0x2b,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_rgb888_39_8","",0x1907,0x1401,0x40,
             0x40,0xb,8,0x27,0x2b,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_rgba8888_47_1","",0x1908,0x1401,0x40
             ,0x40,10,1,0x2f,0x1b,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_rgba8888_47_2","",0x1908,0x1401,0x40
             ,0x40,10,1,0x2f,0x1b,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_rgba8888_47_4","",0x1908,0x1401,0x40
             ,0x40,10,1,0x2f,0x1b,4);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(Context *)this_08[1]._vptr_TestNode,"cube_rgba8888_47_8","",0x1908,0x1401,0x40
             ,0x40,10,1,0x2f,0x1b,8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar10);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,this_08->m_testCtx,"basic_copyteximage2d",
             "Basic glCopyTexImage2D() usage");
  tcu::TestNode::addChild(this_08,pTVar6);
  pBVar11 = (BasicCopyTexImage2DCase *)operator_new(0xa08);
  BasicCopyTexImage2DCase::BasicCopyTexImage2DCase
            (pBVar11,(Context *)this_08[1]._vptr_TestNode,"2d_alpha","",0x1906,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar11);
  pBVar11 = (BasicCopyTexImage2DCase *)operator_new(0xa08);
  BasicCopyTexImage2DCase::BasicCopyTexImage2DCase
            (pBVar11,(Context *)this_08[1]._vptr_TestNode,"2d_luminance","",0x1909,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar11);
  pBVar11 = (BasicCopyTexImage2DCase *)operator_new(0xa08);
  BasicCopyTexImage2DCase::BasicCopyTexImage2DCase
            (pBVar11,(Context *)this_08[1]._vptr_TestNode,"2d_luminance_alpha","",0x190a,1,0x80,0x40
            );
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar11);
  pBVar11 = (BasicCopyTexImage2DCase *)operator_new(0xa08);
  BasicCopyTexImage2DCase::BasicCopyTexImage2DCase
            (pBVar11,(Context *)this_08[1]._vptr_TestNode,"2d_rgb","",0x1907,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar11);
  pBVar11 = (BasicCopyTexImage2DCase *)operator_new(0xa08);
  BasicCopyTexImage2DCase::BasicCopyTexImage2DCase
            (pBVar11,(Context *)this_08[1]._vptr_TestNode,"2d_rgba","",0x1908,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar11);
  pBVar12 = (BasicCopyTexImageCubeCase *)operator_new(0xa08);
  BasicCopyTexImageCubeCase::BasicCopyTexImageCubeCase
            (pBVar12,(Context *)this_08[1]._vptr_TestNode,"cube_alpha","",0x1906,1,0x40,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar12);
  pBVar12 = (BasicCopyTexImageCubeCase *)operator_new(0xa08);
  BasicCopyTexImageCubeCase::BasicCopyTexImageCubeCase
            (pBVar12,(Context *)this_08[1]._vptr_TestNode,"cube_luminance","",0x1909,1,0x40,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar12);
  pBVar12 = (BasicCopyTexImageCubeCase *)operator_new(0xa08);
  BasicCopyTexImageCubeCase::BasicCopyTexImageCubeCase
            (pBVar12,(Context *)this_08[1]._vptr_TestNode,"cube_luminance_alpha","",0x190a,1,0x40,
             0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar12);
  pBVar12 = (BasicCopyTexImageCubeCase *)operator_new(0xa08);
  BasicCopyTexImageCubeCase::BasicCopyTexImageCubeCase
            (pBVar12,(Context *)this_08[1]._vptr_TestNode,"cube_rgb","",0x1907,1,0x40,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar12);
  pBVar12 = (BasicCopyTexImageCubeCase *)operator_new(0xa08);
  BasicCopyTexImageCubeCase::BasicCopyTexImageCubeCase
            (pBVar12,(Context *)this_08[1]._vptr_TestNode,"cube_rgba","",0x1908,1,0x40,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar12);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,this_08->m_testCtx,"basic_copytexsubimage2d",
             "Basic glCopyTexSubImage2D() usage");
  tcu::TestNode::addChild(this_08,pTVar6);
  pBVar13 = (BasicCopyTexSubImage2DCase *)operator_new(0xa08);
  BasicCopyTexSubImage2DCase::BasicCopyTexSubImage2DCase
            (pBVar13,(Context *)this_08[1]._vptr_TestNode,"2d_alpha","",0x1906,0x1401,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar13);
  pBVar13 = (BasicCopyTexSubImage2DCase *)operator_new(0xa08);
  BasicCopyTexSubImage2DCase::BasicCopyTexSubImage2DCase
            (pBVar13,(Context *)this_08[1]._vptr_TestNode,"2d_luminance","",0x1909,0x1401,1,0x80,
             0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar13);
  pBVar13 = (BasicCopyTexSubImage2DCase *)operator_new(0xa08);
  BasicCopyTexSubImage2DCase::BasicCopyTexSubImage2DCase
            (pBVar13,(Context *)this_08[1]._vptr_TestNode,"2d_luminance_alpha","",0x190a,0x1401,1,
             0x80,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar13);
  pBVar13 = (BasicCopyTexSubImage2DCase *)operator_new(0xa08);
  BasicCopyTexSubImage2DCase::BasicCopyTexSubImage2DCase
            (pBVar13,(Context *)this_08[1]._vptr_TestNode,"2d_rgb","",0x1907,0x1401,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar13);
  pBVar13 = (BasicCopyTexSubImage2DCase *)operator_new(0xa08);
  BasicCopyTexSubImage2DCase::BasicCopyTexSubImage2DCase
            (pBVar13,(Context *)this_08[1]._vptr_TestNode,"2d_rgba","",0x1908,0x1401,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar13);
  pBVar14 = (BasicCopyTexSubImageCubeCase *)operator_new(0xa08);
  BasicCopyTexSubImageCubeCase::BasicCopyTexSubImageCubeCase
            (pBVar14,(Context *)this_08[1]._vptr_TestNode,"cube_alpha","",0x1906,0x1401,1,0x40,0x40)
  ;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar14);
  pBVar14 = (BasicCopyTexSubImageCubeCase *)operator_new(0xa08);
  BasicCopyTexSubImageCubeCase::BasicCopyTexSubImageCubeCase
            (pBVar14,(Context *)this_08[1]._vptr_TestNode,"cube_luminance","",0x1909,0x1401,1,0x40,
             0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar14);
  pBVar14 = (BasicCopyTexSubImageCubeCase *)operator_new(0xa08);
  BasicCopyTexSubImageCubeCase::BasicCopyTexSubImageCubeCase
            (pBVar14,(Context *)this_08[1]._vptr_TestNode,"cube_luminance_alpha","",0x190a,0x1401,1,
             0x40,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar14);
  pBVar14 = (BasicCopyTexSubImageCubeCase *)operator_new(0xa08);
  BasicCopyTexSubImageCubeCase::BasicCopyTexSubImageCubeCase
            (pBVar14,(Context *)this_08[1]._vptr_TestNode,"cube_rgb","",0x1907,0x1401,1,0x40,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar14);
  pBVar14 = (BasicCopyTexSubImageCubeCase *)operator_new(0xa08);
  BasicCopyTexSubImageCubeCase::BasicCopyTexSubImageCubeCase
            (pBVar14,(Context *)this_08[1]._vptr_TestNode,"cube_rgba","",0x1908,0x1401,1,0x40,0x40);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar14);
  return extraout_EAX;
}

Assistant:

void TextureSpecificationTests::init (void)
{
	struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	// Basic TexImage2D usage.
	{
		tcu::TestCaseGroup* basicTexImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_teximage2d", "Basic glTexImage2D() usage");
		addChild(basicTexImageGroup);
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			const char*	fmtName		= texFormats[formatNdx].name;
			deUint32	format		= texFormats[formatNdx].format;
			deUint32	dataType	= texFormats[formatNdx].dataType;
			const int	tex2DWidth	= 64;
			const int	tex2DHeight	= 128;
			const int	texCubeSize	= 64;

			basicTexImageGroup->addChild(new BasicTexImage2DCase	(m_context,	(string(fmtName) + "_2d").c_str(),		"",	format, dataType, MIPMAPS, tex2DWidth, tex2DHeight));
			basicTexImageGroup->addChild(new BasicTexImageCubeCase	(m_context,	(string(fmtName) + "_cube").c_str(),	"",	format, dataType, MIPMAPS, texCubeSize, texCubeSize));
		}
	}

	// Randomized TexImage2D order.
	{
		tcu::TestCaseGroup* randomTexImageGroup = new tcu::TestCaseGroup(m_testCtx, "random_teximage2d", "Randomized glTexImage2D() usage");
		addChild(randomTexImageGroup);

		de::Random rnd(9);

		// 2D cases.
		for (int ndx = 0; ndx < 10; ndx++)
		{
			int		formatNdx	= rnd.getInt(0, DE_LENGTH_OF_ARRAY(texFormats)-1);
			int		width		= 1 << rnd.getInt(2, 8);
			int		height		= 1 << rnd.getInt(2, 8);

			randomTexImageGroup->addChild(new RandomOrderTexImage2DCase(m_context, (string("2d_") + de::toString(ndx)).c_str(), "", texFormats[formatNdx].format, texFormats[formatNdx].dataType, MIPMAPS, width, height));
		}

		// Cubemap cases.
		for (int ndx = 0; ndx < 10; ndx++)
		{
			int		formatNdx	= rnd.getInt(0, DE_LENGTH_OF_ARRAY(texFormats)-1);
			int		size		= 1 << rnd.getInt(2, 8);

			randomTexImageGroup->addChild(new RandomOrderTexImageCubeCase(m_context, (string("cube_") + de::toString(ndx)).c_str(), "", texFormats[formatNdx].format, texFormats[formatNdx].dataType, MIPMAPS, size, size));
		}
	}

	// TexImage2D unpack alignment.
	{
		tcu::TestCaseGroup* alignGroup = new tcu::TestCaseGroup(m_testCtx, "teximage2d_align", "glTexImage2D() unpack alignment tests");
		addChild(alignGroup);

		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_4_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			MIPMAPS,	 4, 8, 8));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_63_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 30, 1));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_63_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 30, 2));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_63_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 30, 4));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_63_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 30, 8));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba4444_51_1",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 30, 1));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba4444_51_2",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 30, 2));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba4444_51_4",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 30, 4));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba4444_51_8",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 30, 8));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgb888_39_1",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 43, 1));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgb888_39_2",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 43, 2));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgb888_39_4",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 43, 4));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgb888_39_8",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 43, 8));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba8888_47_1",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 27, 1));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba8888_47_2",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 27, 2));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba8888_47_4",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 27, 4));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba8888_47_8",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 27, 8));

		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_4_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			MIPMAPS,	 4, 4, 8));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_63_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 63, 1));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_63_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 63, 2));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_63_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 63, 4));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_63_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 63, 8));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba4444_51_1",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 51, 1));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba4444_51_2",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 51, 2));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba4444_51_4",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 51, 4));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba4444_51_8",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 51, 8));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgb888_39_1",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 39, 1));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgb888_39_2",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 39, 2));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgb888_39_4",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 39, 4));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgb888_39_8",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 39, 8));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba8888_47_1",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 47, 1));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba8888_47_2",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 47, 2));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba8888_47_4",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 47, 4));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba8888_47_8",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 47, 8));
	}

	// Basic TexSubImage2D usage.
	{
		tcu::TestCaseGroup* basicTexSubImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_texsubimage2d", "Basic glTexSubImage2D() usage");
		addChild(basicTexSubImageGroup);
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			const char*	fmtName		= texFormats[formatNdx].name;
			deUint32	format		= texFormats[formatNdx].format;
			deUint32	dataType	= texFormats[formatNdx].dataType;
			const int	tex2DWidth	= 64;
			const int	tex2DHeight	= 128;
			const int	texCubeSize	= 64;

			basicTexSubImageGroup->addChild(new BasicTexSubImage2DCase		(m_context,	(string(fmtName) + "_2d").c_str(),		"",	format, dataType, MIPMAPS, tex2DWidth, tex2DHeight));
			basicTexSubImageGroup->addChild(new BasicTexSubImageCubeCase	(m_context,	(string(fmtName) + "_cube").c_str(),	"",	format, dataType, MIPMAPS, texCubeSize, texCubeSize));
		}
	}

	// TexSubImage2D to empty texture.
	{
		tcu::TestCaseGroup* texSubImageEmptyTexGroup = new tcu::TestCaseGroup(m_testCtx, "texsubimage2d_empty_tex", "glTexSubImage2D() to texture that has storage but no data");
		addChild(texSubImageEmptyTexGroup);
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			const char*	fmtName		= texFormats[formatNdx].name;
			deUint32	format		= texFormats[formatNdx].format;
			deUint32	dataType	= texFormats[formatNdx].dataType;
			const int	tex2DWidth	= 64;
			const int	tex2DHeight	= 32;
			const int	texCubeSize	= 32;

			texSubImageEmptyTexGroup->addChild(new TexSubImage2DEmptyTexCase	(m_context,	(string(fmtName) + "_2d").c_str(),		"",	format, dataType, MIPMAPS, tex2DWidth, tex2DHeight));
			texSubImageEmptyTexGroup->addChild(new TexSubImageCubeEmptyTexCase	(m_context,	(string(fmtName) + "_cube").c_str(),	"",	format, dataType, MIPMAPS, texCubeSize, texCubeSize));
		}
	}

	// TexSubImage2D alignment cases.
	{
		tcu::TestCaseGroup* alignGroup = new tcu::TestCaseGroup(m_testCtx, "texsubimage2d_align", "glTexSubImage2D() unpack alignment tests");
		addChild(alignGroup);

		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_1_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_1_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_1_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_1_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 8));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_63_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_63_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_63_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_63_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 8));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba4444_51_1",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba4444_51_2",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba4444_51_4",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba4444_51_8",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 8));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgb888_39_1",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgb888_39_2",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgb888_39_4",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgb888_39_8",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 8));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba8888_47_1",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba8888_47_2",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba8888_47_4",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba8888_47_8",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 8));

		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_1_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_1_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_1_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_1_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 8));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_63_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_63_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_63_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_63_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 8));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba4444_51_1",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba4444_51_2",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba4444_51_4",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba4444_51_8",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 8));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgb888_39_1",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgb888_39_2",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgb888_39_4",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgb888_39_8",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 8));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba8888_47_1",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba8888_47_2",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba8888_47_4",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba8888_47_8",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 8));
	}

	// Basic glCopyTexImage2D() cases
	{
		tcu::TestCaseGroup* copyTexImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_copyteximage2d", "Basic glCopyTexImage2D() usage");
		addChild(copyTexImageGroup);

		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_alpha",				"",	GL_ALPHA,			MIPMAPS,	128, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_luminance",			"",	GL_LUMINANCE,		MIPMAPS,	128, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_luminance_alpha",	"",	GL_LUMINANCE_ALPHA,	MIPMAPS,	128, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_rgb",				"",	GL_RGB,				MIPMAPS,	128, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_rgba",				"",	GL_RGBA,			MIPMAPS,	128, 64));

		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_alpha",			"",	GL_ALPHA,			MIPMAPS,	64, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_luminance",		"",	GL_LUMINANCE,		MIPMAPS,	64, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_luminance_alpha",	"",	GL_LUMINANCE_ALPHA,	MIPMAPS,	64, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_rgb",				"",	GL_RGB,				MIPMAPS,	64, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_rgba",			"",	GL_RGBA,			MIPMAPS,	64, 64));
	}

	// Basic glCopyTexSubImage2D() cases
	{
		tcu::TestCaseGroup* copyTexSubImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_copytexsubimage2d", "Basic glCopyTexSubImage2D() usage");
		addChild(copyTexSubImageGroup);

		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_alpha",				"",	GL_ALPHA,			GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_luminance",			"",	GL_LUMINANCE,		GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_luminance_alpha",	"",	GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_rgb",				"",	GL_RGB,				GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_rgba",				"",	GL_RGBA,			GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));

		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_alpha",			"",	GL_ALPHA,			GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_luminance",		"",	GL_LUMINANCE,		GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_luminance_alpha",	"",	GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_rgb",				"",	GL_RGB,				GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_rgba",			"",	GL_RGBA,			GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
	}
}